

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

Vector3 __thiscall xatlas::internal::Mesh::computeFaceNormal(Mesh *this,uint32_t face)

{
  Array<xatlas::internal::Vector3> *this_00;
  uint *puVar1;
  Vector3 *b;
  Vector3 *a;
  Vector3 *a_00;
  Array<unsigned_int> *this_01;
  Vector3 VVar2;
  Vector3 local_68;
  Vector3 local_58;
  Vector3 local_48;
  Vector3 local_38;
  
  this_00 = &this->m_positions;
  this_01 = &this->m_indices;
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3);
  b = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3 + 1);
  a = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3 + 2);
  a_00 = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  local_38 = operator-(a_00,b);
  local_48 = operator-(a,b);
  local_58 = cross(&local_38,&local_48);
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68.z = 1.0;
  VVar2 = normalizeSafe(&local_58,&local_68,0.0);
  return VVar2;
}

Assistant:

Vector3 computeFaceNormal(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const Vector3 e0 = p2 - p0;
		const Vector3 e1 = p1 - p0;
		const Vector3 normalAreaScaled = cross(e0, e1);
		return normalizeSafe(normalAreaScaled, Vector3(0, 0, 1), 0.0f);
	}